

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::intThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  void **this;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  deBool dVar3;
  int iVar4;
  TextureChannelClass TVar5;
  InternalError *this_00;
  TextureFormat *pTVar6;
  MessageBuilder *pMVar7;
  TestLog *pTVar8;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  LogImage local_8c0;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  LogImageSet local_7e0;
  TextureFormat local_79c;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  LogImage local_748;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  LogImage local_668;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  LogImage local_588;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  LogImageSet local_4a8;
  MessageBuilder local_468;
  MessageBuilder local_2e8;
  Vector<bool,_4> local_165;
  byte local_161;
  undefined1 local_160 [7];
  bool compareOk;
  tcu local_150 [19];
  Vector<bool,_4> local_13d;
  byte local_139;
  undefined1 local_138 [7];
  bool isOk;
  tcu local_128 [16];
  undefined1 local_118 [8];
  UVec4 diff;
  IVec4 cmpPix;
  IVec4 refPix;
  int x;
  int y;
  int z;
  Vec4 pixelScale;
  Vec4 pixelBias;
  UVec4 maxDiff;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  UVec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  width_00 = ConstPixelBufferAccess::getWidth(reference);
  height_00 = ConstPixelBufferAccess::getHeight(reference);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getDepth(reference);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,width_00,height_00,
             errorMaskStorage.m_data.m_cap._4_4_);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),0,0,0,0);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)&y,1.0,1.0,1.0,1.0);
  do {
    dVar3 = ::deGetFalse();
    if ((((dVar3 != 0) || (iVar4 = ConstPixelBufferAccess::getWidth(result), iVar4 != width_00)) ||
        (iVar4 = ConstPixelBufferAccess::getHeight(result), iVar4 != height_00)) ||
       (iVar4 = ConstPixelBufferAccess::getDepth(result),
       iVar4 != errorMaskStorage.m_data.m_cap._4_4_)) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_00,(char *)0x0,
                 "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
                 ,0x2f2);
      __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  for (x = 0; x < errorMaskStorage.m_data.m_cap._4_4_; x = x + 1) {
    for (refPix.m_data[3] = 0; refPix.m_data[3] < height_00; refPix.m_data[3] = refPix.m_data[3] + 1
        ) {
      for (refPix.m_data[2] = 0; refPix.m_data[2] < width_00;
          refPix.m_data[2] = refPix.m_data[2] + 1) {
        ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)(cmpPix.m_data + 2),(int)reference,refPix.m_data[2],
                   refPix.m_data[3]);
        ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)result,refPix.m_data[2],
                   refPix.m_data[3]);
        operator-((tcu *)local_138,(Vector<int,_4> *)(cmpPix.m_data + 2),
                  (Vector<int,_4> *)(diff.m_data + 2));
        abs<int,4>(local_128,(Vector<int,_4> *)local_138);
        Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)local_118);
        lessThanEqual<unsigned_int,4>
                  ((tcu *)&local_13d,(Vector<unsigned_int,_4> *)local_118,threshold);
        local_139 = boolAll<4>(&local_13d);
        max<unsigned_int,4>(local_150,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),
                            (Vector<unsigned_int,_4> *)local_118);
        pixelBias.m_data._8_8_ = local_150._0_8_;
        if ((local_139 & 1) == 0) {
          Vector<int,_4>::Vector((Vector<int,_4> *)local_160,0xff,0,0,0xff);
        }
        else {
          Vector<int,_4>::Vector((Vector<int,_4> *)local_160,0,0xff,0,0xff);
        }
        PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_a0,(IVec4 *)local_160,refPix.m_data[2],
                   refPix.m_data[3],x);
      }
    }
  }
  lessThanEqual<unsigned_int,4>
            ((tcu *)&local_165,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),threshold);
  local_161 = boolAll<4>(&local_165);
  if (((bool)local_161) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar6 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_79c,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar6,&local_79c);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_800,imageSetName,&local_801);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,imageSetDesc,&local_829);
      LogImageSet::LogImageSet(&local_7e0,&local_800,&local_828);
      pTVar8 = TestLog::operator<<(log,&local_7e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"Result",&local_8e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"Result",&local_909);
      LogImage::LogImage(&local_8c0,&local_8e0,&local_908,result,(Vec4 *)&y,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = TestLog::operator<<(pTVar8,&local_8c0);
      TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_8c0);
      std::__cxx11::string::~string((string *)&local_908);
      std::allocator<char>::~allocator(&local_909);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      LogImageSet::~LogImageSet(&local_7e0);
      std::__cxx11::string::~string((string *)&local_828);
      std::allocator<char>::~allocator(&local_829);
      std::__cxx11::string::~string((string *)&local_800);
      std::allocator<char>::~allocator(&local_801);
    }
    goto LAB_012022d9;
  }
  pTVar6 = ConstPixelBufferAccess::getFormat(reference);
  TVar5 = getTextureChannelClass(pTVar6->type);
  if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    pTVar6 = ConstPixelBufferAccess::getFormat(result);
    TVar5 = getTextureChannelClass(pTVar6->type);
    if (TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_01201761;
  }
  else {
LAB_01201761:
    anon_unknown_47::computeScaleAndBias
              (reference,result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
    TestLog::operator<<(&local_2e8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_2e8,
                        (char (*) [61])
                        "Result and reference images are normalized with formula p * ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)&y);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [4])0x133100b);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)(pixelScale.m_data + 2));
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_2e8);
  }
  if ((local_161 & 1) == 0) {
    TestLog::operator<<(&local_468,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_468,(char (*) [43])"Image comparison failed: max difference = ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2));
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [15])0x1380335);
    pMVar7 = MessageBuilder::operator<<(pMVar7,threshold);
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_468);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,imageSetName,&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,imageSetDesc,&local_4f1);
  LogImageSet::LogImageSet(&local_4a8,&local_4c8,&local_4f0);
  pTVar8 = TestLog::operator<<(log,&local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"Result",&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"Result",&local_5d1);
  LogImage::LogImage(&local_588,&local_5a8,&local_5d0,result,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"Reference",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"Reference",&local_6b1);
  LogImage::LogImage(&local_668,&local_688,&local_6b0,reference,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"ErrorMask",&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"Error mask",&local_791);
  LogImage::LogImage(&local_748,&local_768,&local_790,(ConstPixelBufferAccess *)local_a0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_748);
  TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
  LogImage::~LogImage(&local_748);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  LogImage::~LogImage(&local_668);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  LogImage::~LogImage(&local_588);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  LogImageSet::~LogImageSet(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
LAB_012022d9:
  bVar1 = local_161;
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return (bool)(bVar1 & 1);
}

Assistant:

bool intThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				IVec4	refPix		= reference.getPixelInt(x, y, z);
				IVec4	cmpPix		= result.getPixelInt(x, y, z);

				UVec4	diff		= abs(refPix - cmpPix).cast<deUint32>();
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? IVec4(0, 0xff, 0, 0xff) : IVec4(0xff, 0, 0, 0xff), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}